

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O0

int is_static_var(sm_ref expr)

{
  int *in_RDI;
  sm_ref in_stack_ffffffffffffffe8;
  int local_4;
  
  if (*in_RDI == 0xd) {
    local_4 = is_static_var(in_stack_ffffffffffffffe8);
  }
  else {
    if (*in_RDI != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/ffs/ffs/cod/cg.c"
                    ,0xa03,"int is_static_var(sm_ref)");
    }
    local_4 = in_RDI[8];
  }
  return local_4;
}

Assistant:

static int 
is_static_var(sm_ref expr)
{
    if (expr->node_type == cod_identifier) {
	return is_static_var(expr->node.identifier.sm_declaration);
    } else if (expr->node_type == cod_declaration) {
	return expr->node.declaration.static_var;
    } else {
	assert(0);
    }
    return 0;
}